

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctionHandler.cpp
# Opt level: O2

void __thiscall ExpressionFunctionHandler::updateArchitecture(ExpressionFunctionHandler *this)

{
  pointer pIVar1;
  Architecture *pAVar2;
  Identifier *name;
  pointer __x;
  
  pIVar1 = (this->architectureFunctions).super__Vector_base<Identifier,_std::allocator<Identifier>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__x = (this->architectureFunctions).
             super__Vector_base<Identifier,_std::allocator<Identifier>_>._M_impl.
             super__Vector_impl_data._M_start; __x != pIVar1; __x = __x + 1) {
    std::
    _Rb_tree<Identifier,_std::pair<const_Identifier,_ExpressionFunctionHandler::Entry>,_std::_Select1st<std::pair<const_Identifier,_ExpressionFunctionHandler::Entry>_>,_std::less<Identifier>,_std::allocator<std::pair<const_Identifier,_ExpressionFunctionHandler::Entry>_>_>
    ::erase((_Rb_tree<Identifier,_std::pair<const_Identifier,_ExpressionFunctionHandler::Entry>,_std::_Select1st<std::pair<const_Identifier,_ExpressionFunctionHandler::Entry>_>,_std::less<Identifier>,_std::allocator<std::pair<const_Identifier,_ExpressionFunctionHandler::Entry>_>_>
             *)this,__x);
  }
  std::vector<Identifier,_std::allocator<Identifier>_>::clear(&this->architectureFunctions);
  this->registeringArchitecture = true;
  pAVar2 = Architecture::current();
  (*pAVar2->_vptr_Architecture[2])(pAVar2,this);
  this->registeringArchitecture = false;
  return;
}

Assistant:

void ExpressionFunctionHandler::updateArchitecture()
{
	// remove functions of previous architecture
	for (const auto &name : architectureFunctions)
	{
		entries.erase(name);
	}

	architectureFunctions.clear();

	// Add functions of current architecture. Remember functions that were added
	registeringArchitecture = true;
	Architecture::current().registerExpressionFunctions(*this);
	registeringArchitecture = false;
}